

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Io_FileType_t Io_ReadFileType(char *pFileName)

{
  int iVar1;
  char *__s1;
  char *pExt;
  char *pFileName_local;
  
  if (pFileName == (char *)0x0) {
    pFileName_local._4_4_ = IO_FILE_NONE;
  }
  else {
    __s1 = Extra_FileNameExtension(pFileName);
    if (__s1 == (char *)0x0) {
      pFileName_local._4_4_ = IO_FILE_NONE;
    }
    else {
      iVar1 = strcmp(__s1,"aig");
      if (iVar1 == 0) {
        pFileName_local._4_4_ = IO_FILE_AIGER;
      }
      else {
        iVar1 = strcmp(__s1,"baf");
        if (iVar1 == 0) {
          pFileName_local._4_4_ = IO_FILE_BAF;
        }
        else {
          iVar1 = strcmp(__s1,"bblif");
          if (iVar1 == 0) {
            pFileName_local._4_4_ = IO_FILE_BBLIF;
          }
          else {
            iVar1 = strcmp(__s1,"blif");
            if (iVar1 == 0) {
              pFileName_local._4_4_ = IO_FILE_BLIF;
            }
            else {
              iVar1 = strcmp(__s1,"bench");
              if (iVar1 == 0) {
                pFileName_local._4_4_ = IO_FILE_BENCH;
              }
              else {
                iVar1 = strcmp(__s1,"cnf");
                if (iVar1 == 0) {
                  pFileName_local._4_4_ = IO_FILE_CNF;
                }
                else {
                  iVar1 = strcmp(__s1,"dot");
                  if (iVar1 == 0) {
                    pFileName_local._4_4_ = IO_FILE_DOT;
                  }
                  else {
                    iVar1 = strcmp(__s1,"edif");
                    if (iVar1 == 0) {
                      pFileName_local._4_4_ = IO_FILE_EDIF;
                    }
                    else {
                      iVar1 = strcmp(__s1,"eqn");
                      if (iVar1 == 0) {
                        pFileName_local._4_4_ = IO_FILE_EQN;
                      }
                      else {
                        iVar1 = strcmp(__s1,"gml");
                        if (iVar1 == 0) {
                          pFileName_local._4_4_ = IO_FILE_GML;
                        }
                        else {
                          iVar1 = strcmp(__s1,"list");
                          if (iVar1 == 0) {
                            pFileName_local._4_4_ = IO_FILE_LIST;
                          }
                          else {
                            iVar1 = strcmp(__s1,"mv");
                            if (iVar1 == 0) {
                              pFileName_local._4_4_ = IO_FILE_BLIFMV;
                            }
                            else {
                              iVar1 = strcmp(__s1,"pla");
                              if (iVar1 == 0) {
                                pFileName_local._4_4_ = IO_FILE_PLA;
                              }
                              else {
                                iVar1 = strcmp(__s1,"smv");
                                if (iVar1 == 0) {
                                  pFileName_local._4_4_ = IO_FILE_SMV;
                                }
                                else {
                                  iVar1 = strcmp(__s1,"v");
                                  if (iVar1 == 0) {
                                    pFileName_local._4_4_ = IO_FILE_VERILOG;
                                  }
                                  else {
                                    pFileName_local._4_4_ = IO_FILE_UNKNOWN;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pFileName_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the file type.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Io_FileType_t Io_ReadFileType( char * pFileName )
{
    char * pExt;
    if ( pFileName == NULL )
        return IO_FILE_NONE;
    pExt = Extra_FileNameExtension( pFileName );
    if ( pExt == NULL )
        return IO_FILE_NONE;
    if ( !strcmp( pExt, "aig" ) )
        return IO_FILE_AIGER;
    if ( !strcmp( pExt, "baf" ) )
        return IO_FILE_BAF;
    if ( !strcmp( pExt, "bblif" ) )
        return IO_FILE_BBLIF;
    if ( !strcmp( pExt, "blif" ) )
        return IO_FILE_BLIF;
    if ( !strcmp( pExt, "bench" ) )
        return IO_FILE_BENCH;
    if ( !strcmp( pExt, "cnf" ) )
        return IO_FILE_CNF;
    if ( !strcmp( pExt, "dot" ) )
        return IO_FILE_DOT;
    if ( !strcmp( pExt, "edif" ) )
        return IO_FILE_EDIF;
    if ( !strcmp( pExt, "eqn" ) )
        return IO_FILE_EQN;
    if ( !strcmp( pExt, "gml" ) )
        return IO_FILE_GML;
    if ( !strcmp( pExt, "list" ) )
        return IO_FILE_LIST;
    if ( !strcmp( pExt, "mv" ) )
        return IO_FILE_BLIFMV;
    if ( !strcmp( pExt, "pla" ) )
        return IO_FILE_PLA;
    if ( !strcmp( pExt, "smv" ) )
        return IO_FILE_SMV;
    if ( !strcmp( pExt, "v" ) )
        return IO_FILE_VERILOG;
    return IO_FILE_UNKNOWN;
}